

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O3

int CVApolynomialGetY(CVodeMem cv_mem,sunrealtype t,N_Vector y,N_Vector *yS)

{
  uint uVar1;
  CVadjMemRec *pCVar2;
  CVdtpntMemRec **ppCVar3;
  CVdtpntMemRec *pCVar4;
  undefined8 *puVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  sunrealtype *psVar15;
  CVdtpntMemRec **ppCVar16;
  ulong uVar17;
  N_Vector **ppp_Var18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int newpoint;
  long indx;
  int local_bc;
  CVdtpntMemRec **local_b8;
  ulong uStack_b0;
  N_Vector local_a0;
  CVdtpntMemRec **local_98;
  sunrealtype local_90;
  undefined1 local_88 [16];
  N_Vector *local_70;
  undefined1 local_68 [16];
  CVdtpntMemRec **local_50;
  undefined1 local_48 [16];
  long lVar23;
  
  pCVar2 = cv_mem->cv_adj_mem;
  uVar12 = 0;
  if ((yS != (N_Vector *)0x0) && (pCVar2->ca_IMinterpSensi != 0)) {
    uVar12 = (ulong)(uint)cv_mem->cv_Ns;
  }
  ppCVar3 = pCVar2->dt_mem;
  local_90 = t;
  local_70 = yS;
  iVar7 = CVAfindIndex(cv_mem,t,(long *)&local_50,&local_bc);
  auVar21 = local_88;
  if (iVar7 != 0) {
    return iVar7;
  }
  iVar7 = (int)uVar12;
  if (local_50 == (CVdtpntMemRec **)0x0) {
    puVar5 = (undefined8 *)(*ppCVar3)->content;
    N_VScale(0x3ff0000000000000,*puVar5,y);
    auVar21 = _DAT_00138040;
    if (iVar7 < 1) {
      return 0;
    }
    psVar15 = cv_mem->cv_cvals;
    lVar10 = uVar12 - 1;
    auVar19._8_4_ = (int)lVar10;
    auVar19._0_8_ = lVar10;
    auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar19 = auVar19 ^ _DAT_00138040;
    auVar25 = _DAT_00138030;
    do {
      bVar6 = auVar19._0_4_ < SUB164(auVar25 ^ auVar21,0);
      iVar8 = auVar19._4_4_;
      iVar9 = SUB164(auVar25 ^ auVar21,4);
      if ((bool)(~(iVar8 < iVar9 || iVar9 == iVar8 && bVar6) & 1)) {
        *(undefined8 *)((long)psVar15 + lVar10) = 0x3ff0000000000000;
      }
      if (iVar8 >= iVar9 && (iVar9 != iVar8 || !bVar6)) {
        *(undefined8 *)((long)psVar15 + lVar10 + 8) = 0x3ff0000000000000;
      }
      lVar11 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar11 + 2;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(iVar7 + 1U >> 1) << 4 != lVar10);
    iVar7 = N_VScaleVectorArray(uVar12,psVar15,puVar5[1],local_70);
    goto LAB_0010e200;
  }
  auVar26._0_8_ = ABS(ppCVar3[(long)local_50]->t - ppCVar3[(long)local_50 + -1]->t);
  auVar26._8_8_ = 0;
  if (pCVar2->ca_tfinal <= pCVar2->ca_tinitial) {
    uVar1 = *(uint *)((long)ppCVar3[(long)local_50 + -1]->content + 0x10);
    ppCVar16 = (CVdtpntMemRec **)(long)(int)uVar1;
    local_b8 = (CVdtpntMemRec **)(~(ulong)ppCVar16 + pCVar2->ca_np);
    if (pCVar2->ca_np - (long)local_50 <= (long)ppCVar16) {
      local_b8 = (CVdtpntMemRec **)((long)local_50 + -1);
    }
    if (local_bc != 0) {
      if (pCVar2->ca_tinitial < pCVar2->ca_tfinal) goto LAB_0010dd8e;
      if (-1 < (int)uVar1) {
        local_b8 = ppCVar3 + (long)local_b8 + -1;
        lVar10 = uVar12 - 1;
        auVar21._8_4_ = (int)lVar10;
        auVar21._0_8_ = lVar10;
        auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
        lVar10 = 0;
        local_88 = auVar21 ^ _DAT_00138040;
        local_a0 = y;
        local_98 = ppCVar16;
        local_68 = auVar26;
        do {
          pCVar4 = local_b8[lVar10];
          pCVar2->ca_T[lVar10] = pCVar4->t;
          puVar5 = (undefined8 *)pCVar4->content;
          N_VScale(0x3ff0000000000000,*puVar5,pCVar2->ca_Y[lVar10]);
          auVar21 = _DAT_00138040;
          if (0 < iVar7) {
            psVar15 = cv_mem->cv_cvals;
            lVar11 = 0;
            auVar22 = _DAT_00138030;
            do {
              bVar6 = local_88._0_4_ < SUB164(auVar22 ^ auVar21,0);
              iVar8 = SUB164(auVar22 ^ auVar21,4);
              iVar9 = local_88._4_4_;
              if ((bool)(~(iVar9 < iVar8 || iVar8 == iVar9 && bVar6) & 1)) {
                *(undefined8 *)((long)psVar15 + lVar11) = 0x3ff0000000000000;
              }
              if (iVar9 >= iVar8 && (iVar8 != iVar9 || !bVar6)) {
                *(undefined8 *)((long)psVar15 + lVar11 + 8) = 0x3ff0000000000000;
              }
              lVar23 = auVar22._8_8_;
              auVar22._0_8_ = auVar22._0_8_ + 2;
              auVar22._8_8_ = lVar23 + 2;
              lVar11 = lVar11 + 0x10;
            } while ((ulong)(iVar7 + 1U >> 1) << 4 != lVar11);
            iVar8 = N_VScaleVectorArray(uVar12,psVar15,puVar5[1]);
            if (iVar8 != 0) {
              return -0x1c;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != (ulong)uVar1 + 1);
        goto LAB_0010e044;
      }
      goto LAB_0010e1a0;
    }
LAB_0010e131:
    psVar15 = cv_mem->cv_cvals;
    *psVar15 = 1.0;
    iVar8 = (int)ppCVar16;
    if (0 < iVar8) {
      dVar24 = 1.0;
      uVar12 = 0;
      do {
        dVar24 = ((local_90 - pCVar2->ca_T[uVar12]) * dVar24) / auVar26._0_8_;
        psVar15[uVar12 + 1] = dVar24;
        uVar12 = uVar12 + 1;
      } while (((ulong)ppCVar16 & 0xffffffff) != uVar12);
    }
  }
  else {
    ppCVar16 = (CVdtpntMemRec **)(long)*(int *)((long)ppCVar3[(long)local_50]->content + 0x10);
    local_b8 = ppCVar16;
    if ((long)ppCVar16 < (long)local_50) {
      local_b8 = local_50;
    }
    if (local_bc == 0) goto LAB_0010e131;
LAB_0010dd8e:
    if (-1 < (int)ppCVar16) {
      local_88._4_4_ = 0;
      local_88._0_4_ = (int)ppCVar16 + 1;
      local_88._8_8_ = auVar21._8_8_;
      lVar10 = uVar12 - 1;
      local_48._8_4_ = (int)lVar10;
      local_48._0_8_ = lVar10;
      local_48._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar10 = 0;
      local_48 = local_48 ^ _DAT_00138040;
      local_a0 = y;
      local_98 = ppCVar16;
      local_68 = auVar26;
      do {
        pCVar4 = ppCVar3[(long)local_b8 - lVar10];
        pCVar2->ca_T[lVar10] = pCVar4->t;
        puVar5 = (undefined8 *)pCVar4->content;
        N_VScale(0x3ff0000000000000,*puVar5,pCVar2->ca_Y[lVar10]);
        auVar21 = _DAT_00138040;
        if (0 < iVar7) {
          psVar15 = cv_mem->cv_cvals;
          lVar11 = 0;
          auVar20 = _DAT_00138030;
          do {
            bVar6 = local_48._0_4_ < SUB164(auVar20 ^ auVar21,0);
            iVar8 = SUB164(auVar20 ^ auVar21,4);
            iVar9 = local_48._4_4_;
            if ((bool)(~(iVar9 < iVar8 || iVar8 == iVar9 && bVar6) & 1)) {
              *(undefined8 *)((long)psVar15 + lVar11) = 0x3ff0000000000000;
            }
            if (iVar9 >= iVar8 && (iVar8 != iVar9 || !bVar6)) {
              *(undefined8 *)((long)psVar15 + lVar11 + 8) = 0x3ff0000000000000;
            }
            lVar23 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 2;
            auVar20._8_8_ = lVar23 + 2;
            lVar11 = lVar11 + 0x10;
          } while ((ulong)(iVar7 + 1U >> 1) << 4 != lVar11);
          iVar8 = N_VScaleVectorArray(uVar12,psVar15,puVar5[1]);
          if (iVar8 != 0) {
            return -0x1c;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != local_88._0_8_);
LAB_0010e044:
      iVar8 = (int)local_98;
      ppCVar16 = local_98;
      y = local_a0;
      if (0 < iVar8) {
        uVar13 = (ulong)local_98 & 0xffffffff;
        ppp_Var18 = pCVar2->ca_YS + 0xc;
        uVar17 = 1;
        uVar14 = uVar13;
        do {
          do {
            local_b8 = (CVdtpntMemRec **)
                       ((double)local_68._0_8_ / (pCVar2->ca_T[uVar14] - (double)ppp_Var18[uVar14]))
            ;
            local_88._8_8_ = local_68._8_8_ ^ 0x8000000000000000;
            local_88._0_8_ = -(double)local_b8;
            uStack_b0 = local_68._8_8_;
            N_VLinearSum(local_b8,pCVar2->ca_Y[uVar14],pCVar2->ca_Y[uVar14 - 1],pCVar2->ca_Y[uVar14]
                        );
            if (0 < iVar7) {
              iVar9 = N_VLinearSumVectorArray
                                (local_b8,local_88._0_8_,uVar12,pCVar2->ca_YS[uVar14],
                                 pCVar2->ca_Y[uVar14 + 0xc]);
              if (iVar9 != 0) {
                return -0x1c;
              }
            }
            bVar6 = (long)uVar17 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar6);
          uVar17 = uVar17 + 1;
          ppp_Var18 = ppp_Var18 + -1;
          uVar14 = uVar13;
          ppCVar16 = local_98;
          y = local_a0;
          auVar26._0_8_ = (double)local_68._0_8_;
        } while (uVar17 != iVar8 + 1);
        goto LAB_0010e131;
      }
    }
LAB_0010e1a0:
    iVar8 = (int)ppCVar16;
    psVar15 = cv_mem->cv_cvals;
    *psVar15 = 1.0;
  }
  iVar9 = N_VLinearCombination(iVar8 + 1,psVar15,pCVar2->ca_Y,y);
  if (iVar9 != 0) {
    return -0x1c;
  }
  if (iVar7 < 1) {
    return 0;
  }
  iVar7 = N_VLinearCombinationVectorArray(iVar7,iVar8 + 1,cv_mem->cv_cvals,pCVar2->ca_YS,local_70);
LAB_0010e200:
  if (iVar7 == 0) {
    return 0;
  }
  return -0x1c;
}

Assistant:

static int CVApolynomialGetY(CVodeMem cv_mem, sunrealtype t, N_Vector y,
                             N_Vector* yS)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVpolynomialDataMem content;

  int flag, dir, order, i, j, is, NS, retval;
  long int indx, base;
  sunbooleantype newpoint;
  sunrealtype dt, factor;

  ca_mem = cv_mem->cv_adj_mem;
  dt_mem = ca_mem->dt_mem;

  /* Local value of Ns */

  NS = (ca_mem->ca_IMinterpSensi && (yS != NULL)) ? cv_mem->cv_Ns : 0;

  /* Get the index in dt_mem */

  flag = CVAfindIndex(cv_mem, t, &indx, &newpoint);
  if (flag != CV_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (indx == 0)
  {
    content = (CVpolynomialDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content->y, y);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
      retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS, yS);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }

    return (CV_SUCCESS);
  }

  /* Scaling factor */

  dt = SUNRabs(dt_mem[indx]->t - dt_mem[indx - 1]->t);

  /* Find the direction of the forward integration */

  dir = (ca_mem->ca_tfinal - ca_mem->ca_tinitial > ZERO) ? 1 : -1;

  /* Establish the base point depending on the integration direction.
     Modify the base if there are not enough points for the current order */

  if (dir == 1)
  {
    base    = indx;
    content = (CVpolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (indx < order) { base += order - indx; }
  }
  else
  {
    base    = indx - 1;
    content = (CVpolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (ca_mem->ca_np - indx > order) { base -= indx + order - ca_mem->ca_np; }
  }

  /* Recompute Y (divided differences for Newton polynomial) if needed */

  if (newpoint)
  {
    /* Store 0-th order DD */
    if (dir == 1)
    {
      for (j = 0; j <= order; j++)
      {
        ca_mem->ca_T[j] = dt_mem[base - j]->t;
        content         = (CVpolynomialDataMem)(dt_mem[base - j]->content);
        N_VScale(ONE, content->y, ca_mem->ca_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS,
                                       ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }
    else
    {
      for (j = 0; j <= order; j++)
      {
        ca_mem->ca_T[j] = dt_mem[base - 1 + j]->t;
        content         = (CVpolynomialDataMem)(dt_mem[base - 1 + j]->content);
        N_VScale(ONE, content->y, ca_mem->ca_Y[j]);
        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS,
                                       ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }

    /* Compute higher-order DD */
    for (i = 1; i <= order; i++)
    {
      for (j = order; j >= i; j--)
      {
        factor = dt / (ca_mem->ca_T[j] - ca_mem->ca_T[j - i]);
        N_VLinearSum(factor, ca_mem->ca_Y[j], -factor, ca_mem->ca_Y[j - 1],
                     ca_mem->ca_Y[j]);

        if (NS > 0)
        {
          retval = N_VLinearSumVectorArray(NS, factor, ca_mem->ca_YS[j],
                                           -factor, ca_mem->ca_YS[j - 1],
                                           ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }
  }

  /* Perform the actual interpolation using nested multiplications */

  cv_mem->cv_cvals[0] = ONE;
  for (i = 0; i < order; i++)
  {
    cv_mem->cv_cvals[i + 1] = cv_mem->cv_cvals[i] * (t - ca_mem->ca_T[i]) / dt;
  }

  retval = N_VLinearCombination(order + 1, cv_mem->cv_cvals, ca_mem->ca_Y, y);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order + 1, cv_mem->cv_cvals,
                                             ca_mem->ca_YS, yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (CV_SUCCESS);
}